

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

void __thiscall Fl_Text_Display::calc_last_char(Fl_Text_Display *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = this->mNVisibleLines;
  uVar4 = (int)uVar6 >> 0x1f & uVar6;
  uVar1 = uVar6;
  do {
    uVar6 = uVar6 - 1;
    uVar5 = uVar4;
    uVar2 = uVar4 - 1;
    if ((int)uVar1 < 1) break;
    uVar2 = uVar1 - 1;
    uVar5 = uVar1;
    uVar1 = uVar2;
  } while (this->mLineStarts[uVar6] == -1);
  if ((int)uVar5 < 1) {
    iVar3 = 0;
  }
  else {
    iVar3 = line_end(this,this->mLineStarts[uVar2],true);
  }
  this->mLastChar = iVar3;
  return;
}

Assistant:

void Fl_Text_Display::calc_last_char() {
  int i;
  for (i = mNVisibleLines - 1; i >= 0 && mLineStarts[i] == -1; i--) ;
  mLastChar = i < 0 ? 0 : line_end(mLineStarts[i], true);
}